

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O1

void __thiscall
ReconnectingHub::connectionClosed(ReconnectingHub *this,Stream *stream,bool abnormal)

{
  ostream *poVar1;
  string local_48;
  
  this->connected = false;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Lost connection to ",0x13);
  Dashel::Stream::getTargetName_abi_cxx11_(&local_48,stream);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (abnormal) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,*(char **)(stream + 0x10),*(long *)(stream + 0x18));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

virtual void connectionClosed(Stream* stream, bool abnormal)
	{
		connected = false;
		cout << endl
			 << "Lost connection to " << stream->getTargetName();
		if (abnormal)
			cout << " : " << stream->getFailReason();
		cout << endl;
	}